

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdImageColorExactAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  int local_2c;
  int i;
  int a_local;
  int b_local;
  int g_local;
  int r_local;
  gdImagePtr im_local;
  
  if (im->trueColor == 0) {
    for (local_2c = 0; local_2c < im->colorsTotal; local_2c = local_2c + 1) {
      if ((((im->open[local_2c] == 0) && (im->red[local_2c] == r)) && (im->green[local_2c] == g)) &&
         ((im->blue[local_2c] == b && (im->alpha[local_2c] == a)))) {
        return local_2c;
      }
    }
    im_local._4_4_ = -1;
  }
  else {
    im_local._4_4_ = a * 0x1000000 + r * 0x10000 + g * 0x100 + b;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageColorExactAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			continue;
		}
		if ((im->red[i] == r) &&
		        (im->green[i] == g) && (im->blue[i] == b) && (im->alpha[i] == a)) {
			return i;
		}
	}
	return -1;
}